

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O1

double __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
compute_expected_cost
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
           *this,double frac_inserts)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint64_t uVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined8 in_XMM2_Qb;
  ulong local_68;
  uint local_5c;
  long local_58;
  
  if (this->num_keys_ == 0) {
    return 0.0;
  }
  uVar12 = *this->bitmap_;
  local_68 = 0;
  if (uVar12 == 0) {
    uVar7 = (ulong)this->bitmap_size_;
    uVar2 = 0xffffffff;
    if ((long)uVar7 < 2) {
      local_68 = 1;
      uVar12 = 0;
    }
    else {
      local_68 = 1;
      do {
        uVar12 = this->bitmap_[local_68];
        if (uVar12 != 0) goto LAB_0013db59;
        local_68 = local_68 + 1;
      } while (uVar7 != local_68);
      uVar12 = 0;
      local_68 = uVar7;
    }
  }
  else {
LAB_0013db59:
    uVar2 = 0;
    for (uVar7 = uVar12; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
      uVar2 = uVar2 + 1;
    }
    uVar2 = uVar2 | (int)local_68 << 6;
    uVar12 = uVar12 - 1 & uVar12;
  }
  if (uVar2 == 0xffffffff) {
    local_58 = 0;
    iVar11 = 0;
    local_5c = 0;
    dVar17 = 0.0;
    iVar9 = 0;
  }
  else {
    dVar17 = 0.0;
    iVar9 = 0;
    local_5c = 0;
    local_58 = 0;
    uVar10 = 0xffffffff;
    do {
      uVar3 = uVar2;
      uVar2 = this->data_capacity_ - 1;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = (this->super_AlexNode<int,_int>).model_.a_;
      auVar18._0_8_ = (double)this->key_slots_[(int)uVar3];
      auVar18._8_8_ = in_XMM2_Qb;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (this->super_AlexNode<int,_int>).model_.b_;
      auVar1 = vfmadd213sd_fma(auVar18,auVar15,auVar1);
      if ((int)auVar1._0_8_ <= (int)uVar2) {
        uVar2 = (int)auVar1._0_8_;
      }
      iVar4 = (~((int)uVar2 >> 0x1f) & uVar2) - uVar3;
      iVar11 = -iVar4;
      if (0 < iVar4) {
        iVar11 = iVar4;
      }
      dVar14 = log2((double)(iVar11 + 1));
      if ((int)(uVar10 + 1) < (int)uVar3) {
        lVar5 = (long)(int)((uVar10 + 1) - local_5c);
        local_58 = local_58 + ((ulong)(lVar5 * lVar5) >> 2);
        local_5c = uVar3;
      }
      if (uVar12 == 0) {
        uVar6 = (ulong)this->bitmap_size_;
        lVar5 = (long)(int)local_68;
        uVar7 = lVar5 + 1U;
        if ((long)(lVar5 + 1U) < (long)uVar6) {
          lVar8 = 1;
          do {
            uVar12 = this->bitmap_[lVar5 + lVar8];
            if (uVar12 != 0) {
              local_68 = (ulong)(uint)((int)local_68 + (int)lVar8);
              goto LAB_0013dc57;
            }
            lVar8 = lVar8 + 1;
            uVar7 = uVar6;
          } while (uVar6 - lVar5 != lVar8);
        }
        uVar2 = 0xffffffff;
        local_68 = uVar7;
      }
      else {
LAB_0013dc57:
        uVar2 = 0;
        for (uVar7 = uVar12; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
          uVar2 = uVar2 + 1;
        }
        uVar2 = uVar2 | (int)local_68 << 6;
        uVar12 = uVar12 - 1 & uVar12;
      }
      dVar17 = dVar17 + dVar14;
      iVar9 = iVar9 + 1;
      uVar10 = uVar3;
    } while (uVar2 != 0xffffffff);
    iVar11 = uVar3 + 1;
  }
  dVar14 = 0.0;
  dVar17 = (double)((ulong)(iVar9 != 0) * (long)(dVar17 / (double)iVar9));
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar17;
  this->expected_avg_exp_search_iterations_ = dVar17;
  if (iVar9 != 0) {
    dVar14 = (double)(long)(((ulong)((long)(int)(iVar11 - local_5c) * (long)(int)(iVar11 - local_5c)
                                    ) >> 2) + local_58) / (double)iVar9;
  }
  this->expected_avg_shifts_ = dVar14;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar14 * 0.5 * frac_inserts;
  auVar1 = vfmadd231sd_fma(auVar16,auVar13,ZEXT816(0x4034000000000000));
  return auVar1._0_8_;
}

Assistant:

double compute_expected_cost(double frac_inserts = 0) {
    if (num_keys_ == 0) {
      return 0;
    }

    ExpectedSearchIterationsAccumulator search_iters_accumulator;
    ExpectedShiftsAccumulator shifts_accumulator(data_capacity_);
    const_iterator_type it(this, 0);
    for (; !it.is_end(); it++) {
      int predicted_position = std::max(
          0, std::min(data_capacity_ - 1, this->model_.predict(it.key())));
      search_iters_accumulator.accumulate(it.cur_idx_, predicted_position);
      shifts_accumulator.accumulate(it.cur_idx_, predicted_position);
    }
    expected_avg_exp_search_iterations_ = search_iters_accumulator.get_stat();
    expected_avg_shifts_ = shifts_accumulator.get_stat();
    double cost =
        kExpSearchIterationsWeight * expected_avg_exp_search_iterations_ +
        kShiftsWeight * expected_avg_shifts_ * frac_inserts;
    return cost;
  }